

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O0

int rc2_cbc_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t inl)

{
  void *pvVar1;
  EVP_RC2_KEY *key;
  size_t inl_local;
  uint8_t *in_local;
  uint8_t *out_local;
  EVP_CIPHER_CTX *ctx_local;
  
  pvVar1 = ctx->cipher_data;
  inl_local = (size_t)in;
  in_local = out;
  for (key = (EVP_RC2_KEY *)inl; (EVP_RC2_KEY *)0xffff < key;
      key = (EVP_RC2_KEY *)(key[-0x1f1].ks.data + 0x20)) {
    RC2_cbc_encrypt((uchar *)inl_local,in_local,0x10000,(RC2_KEY *)((long)pvVar1 + 4),ctx->iv,
                    ctx->encrypt);
    inl_local = inl_local + 0x10000;
    in_local = in_local + 0x10000;
  }
  if (key != (EVP_RC2_KEY *)0x0) {
    RC2_cbc_encrypt((uchar *)inl_local,in_local,(long)key,(RC2_KEY *)((long)pvVar1 + 4),ctx->iv,
                    ctx->encrypt);
  }
  return 1;
}

Assistant:

static int rc2_cbc_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out, const uint8_t *in,
                          size_t inl) {
  EVP_RC2_KEY *key = (EVP_RC2_KEY *)ctx->cipher_data;
  static const size_t kChunkSize = 0x10000;

  while (inl >= kChunkSize) {
    RC2_cbc_encrypt(in, out, kChunkSize, &key->ks, ctx->iv, ctx->encrypt);
    inl -= kChunkSize;
    in += kChunkSize;
    out += kChunkSize;
  }
  if (inl) {
    RC2_cbc_encrypt(in, out, inl, &key->ks, ctx->iv, ctx->encrypt);
  }
  return 1;
}